

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

size_t __thiscall Imf_3_4::DeepTiledInputFile::totalTiles(DeepTiledInputFile *this)

{
  exr_tile_level_mode_t eVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ArgExc *this_00;
  int iVar6;
  
  eVar1 = ((this->_data).
           super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->tile_level_mode;
  if (eVar1 < EXR_TILE_RIPMAP_LEVELS) {
    iVar2 = numLevels(this);
    if (0 < iVar2) {
      iVar6 = 0;
      iVar2 = 0;
      do {
        iVar3 = numXTiles(this,iVar2);
        iVar4 = numYTiles(this,iVar2);
        iVar6 = iVar6 + iVar4 * iVar3;
        iVar2 = iVar2 + 1;
        iVar3 = numLevels(this);
      } while (iVar2 < iVar3);
      goto LAB_0016fd60;
    }
  }
  else {
    if (eVar1 != EXR_TILE_RIPMAP_LEVELS) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,"Unknown LevelMode format.");
      __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    if (0 < ((this->_data).
             super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->num_y_levels) {
      iVar6 = 0;
      iVar2 = 0;
      do {
        if (0 < ((this->_data).
                 super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->num_x_levels) {
          iVar3 = 0;
          do {
            iVar4 = numXTiles(this,iVar3);
            iVar5 = numYTiles(this,iVar2);
            iVar6 = iVar6 + iVar5 * iVar4;
            iVar3 = iVar3 + 1;
          } while (iVar3 < ((this->_data).
                            super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->num_x_levels);
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < ((this->_data).
                        super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->num_y_levels);
      goto LAB_0016fd60;
    }
  }
  iVar6 = 0;
LAB_0016fd60:
  return (long)iVar6;
}

Assistant:

size_t
DeepTiledInputFile::totalTiles () const
{
    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:

            for (int i_l = 0; i_l < numLevels (); ++i_l)
                numAllTiles += numXTiles (i_l) * numYTiles (i_l);

            break;

        case RIPMAP_LEVELS:

            for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
                for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                    numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }
    return numAllTiles;
}